

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

idx_t __thiscall duckdb::Executor::GetPipelinesProgress(Executor *this,ProgressData *progress)

{
  shared_ptr<duckdb::Pipeline,_true> *psVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  Pipeline *this_00;
  shared_ptr<duckdb::Pipeline,_true> *pipeline;
  shared_ptr<duckdb::Pipeline,_true> *this_01;
  idx_t iVar5;
  ProgressData p;
  ProgressData local_48;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->executor_lock);
  if (iVar4 == 0) {
    progress->done = 0.0;
    progress->total = 0.0;
    psVar1 = (this->pipelines).
             super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar5 = 0;
    for (this_01 = (this->pipelines).
                   super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != psVar1;
        this_01 = this_01 + 1) {
      local_48.done = 0.0;
      local_48.total = 0.0;
      local_48._16_4_ = local_48._16_4_ & 0xffffff00;
      this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->(this_01);
      bVar2 = Pipeline::GetProgress(this_00,&local_48);
      if (bVar2) {
        progress->done = progress->done + local_48.done;
        progress->total = progress->total + local_48.total;
        uVar3 = true;
        if (progress->invalid == false) {
          uVar3 = local_48.invalid;
        }
        progress->invalid = (bool)uVar3;
      }
      else {
        iVar5 = iVar5 + 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->executor_lock);
    return iVar5;
  }
  ::std::__throw_system_error(iVar4);
}

Assistant:

idx_t Executor::GetPipelinesProgress(ProgressData &progress) { // LCOV_EXCL_START
	lock_guard<mutex> elock(executor_lock);

	progress.done = 0;
	progress.total = 0;
	idx_t count_invalid = 0;
	for (auto &pipeline : pipelines) {
		ProgressData p;
		if (!pipeline->GetProgress(p)) {
			count_invalid++;
		} else {
			progress.Add(p);
		}
	}
	return count_invalid;
}